

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::FillBuffer::submit(FillBuffer *this,SubmitContext *context)

{
  PrepareContext *pPVar1;
  VkCommandBuffer pVVar2;
  deUint64 dVar3;
  DeviceInterface *pDVar4;
  ulong uVar5;
  
  pPVar1 = context->m_context;
  pVVar2 = context->m_commandBuffer;
  dVar3 = (pPVar1->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
          m_internal;
  pDVar4 = pPVar1->m_context->m_vkd;
  uVar5 = pPVar1->m_currentBufferSize & 0xfffffffffffffffc;
  this->m_bufferSize = uVar5;
  (*pDVar4->_vptr_DeviceInterface[0x65])(pDVar4,pVVar2,dVar3,0,uVar5,(ulong)this->m_value);
  return;
}

Assistant:

void FillBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd			= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd			= context.getCommandBuffer();
	const vk::VkBuffer			buffer		= context.getBuffer();
	const vk::VkDeviceSize		sizeMask	= ~(0x3ull); // \note Round down to multiple of 4

	m_bufferSize = sizeMask & context.getBufferSize();
	vkd.cmdFillBuffer(cmd, buffer, 0, m_bufferSize, m_value);
}